

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::COBImporter::CanRead(COBImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  char *local_70;
  char *tokens [1];
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string *extension;
  IOSystem *pIStack_28;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  COBImporter *this_local;
  
  extension._7_1_ = checkSig;
  pIStack_28 = pIOHandler;
  pIOHandler_local = (IOSystem *)pFile;
  pFile_local = (string *)this;
  BaseImporter::GetExtension(&local_58,pFile);
  local_38 = &local_58;
  bVar1 = std::operator==(&local_58,"cob");
  if (!bVar1) {
    bVar1 = std::operator==(local_38,"scn");
    if (!bVar1) {
      bVar1 = std::operator==(local_38,"COB");
      if (!bVar1) {
        bVar1 = std::operator==(local_38,"SCN");
        if (!bVar1) {
          lVar2 = std::__cxx11::string::length();
          if (((lVar2 == 0) || ((extension._7_1_ & 1) != 0)) && (pIStack_28 != (IOSystem *)0x0)) {
            local_70 = "Caligary";
            this_local._7_1_ =
                 BaseImporter::SearchFileHeaderForToken
                           (pIStack_28,(string *)pIOHandler_local,&local_70,1,200,false,false);
          }
          else {
            this_local._7_1_ = false;
          }
          goto LAB_0076bc9b;
        }
      }
    }
  }
  this_local._7_1_ = true;
LAB_0076bc9b:
  tokens[0]._0_4_ = 1;
  std::__cxx11::string::~string((string *)&local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool COBImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == "cob" || extension == "scn" || extension == "COB" || extension == "SCN") {
        return true;
    }

    else if ((!extension.length() || checkSig) && pIOHandler)   {
        const char* tokens[] = {"Caligary"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}